

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O3

void __thiscall
QSequentialAnimationGroupPrivate::setCurrentAnimation
          (QSequentialAnimationGroupPrivate *this,int index,bool intermediate)

{
  QBindingStorage *this_00;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *data;
  QObject *sender;
  QBindingStatus *pQVar1;
  QAbstractAnimation *pQVar2;
  QAbstractAnimation *this_01;
  int iVar3;
  long lVar4;
  long in_FS_OFFSET;
  QPropertyData<QAbstractAnimation_*> local_50;
  void *local_48;
  QPropertyData<QAbstractAnimation_*> *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->super_QAnimationGroupPrivate).animations.d.size + -1;
  if (index <= lVar4) {
    lVar4 = (long)index;
  }
  iVar3 = (int)lVar4;
  if (iVar3 == -1) {
    this->currentAnimationIndex = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::setValue(&this->currentAnimation,(parameter_type)0x0);
      return;
    }
    goto LAB_003ae535;
  }
  sender = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.q_ptr;
  if (this->currentAnimationIndex == iVar3) {
    pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    pQVar2 = (this->super_QAnimationGroupPrivate).animations.d.ptr[lVar4];
    if ((pQVar1 != (QBindingStatus *)0x0) &&
       (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper
                (&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                  super_QObjectPrivate.super_QObjectData.bindingStorage,
                 (QUntypedPropertyData *)&this->currentAnimation);
    }
    if (pQVar2 != (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val)
    goto LAB_003ae41e;
  }
  else {
LAB_003ae41e:
    data = &this->currentAnimation;
    this_00 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
               super_QObjectPrivate.super_QObjectData.bindingStorage;
    pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar1 != (QBindingStatus *)0x0) &&
       (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
    }
    this_01 = (QAbstractAnimation *)(data->super_QPropertyData<QAbstractAnimation_*>).val;
    if (this_01 != (QAbstractAnimation *)0x0) {
      pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
               super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar1 != (QBindingStatus *)0x0) &&
         (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
        this_01 = (QAbstractAnimation *)(data->super_QPropertyData<QAbstractAnimation_*>).val;
      }
      QAbstractAnimation::stop(this_01);
    }
    this->currentAnimationIndex = iVar3;
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::setValue(data,(this->super_QAnimationGroupPrivate).animations.d.ptr[lVar4]);
    pQVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar1 != (QBindingStatus *)0x0) &&
       (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
    }
    local_50.val = (this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val;
    local_40 = &local_50;
    local_48 = (void *)0x0;
    QMetaObject::activate(sender,&QSequentialAnimationGroup::staticMetaObject,0,&local_48);
    activateCurrentAnimation(this,intermediate);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003ae535:
  __stack_chk_fail();
}

Assistant:

void QSequentialAnimationGroupPrivate::setCurrentAnimation(int index, bool intermediate)
{
    Q_Q(QSequentialAnimationGroup);
    // currentAnimation.removeBindingUnlessInWrapper()
    // is not necessary here, since it is read only

    index = qMin(index, animations.size() - 1);

    if (index == -1) {
        Q_ASSERT(animations.isEmpty());
        currentAnimationIndex = -1;
        currentAnimation = nullptr;
        return;
    }

    // need these two checks below because this func can be called after the current animation
    // has been removed
    if (index == currentAnimationIndex && animations.at(index) == currentAnimation)
        return;

    // stop the old current animation
    if (currentAnimation)
        currentAnimation->stop();

    currentAnimationIndex = index;
    currentAnimation = animations.at(index);

    emit q->currentAnimationChanged(currentAnimation);

    activateCurrentAnimation(intermediate);
}